

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void PostCheckApplyEnclosesArgs
               (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,ApplyCheck *applyCheck)

{
  bool bVar1;
  ParseNodeCall *callNode;
  
  if ((((pnode != (ParseNode *)0x0) && (applyCheck->matches == true)) && (pnode->nop == knopCall))
     && ((pnode->field_0x1 & 1) == 0)) {
    callNode = ParseNode::AsParseNodeCall(pnode);
    bVar1 = IsApplyArgs(callNode);
    if (bVar1) {
      if (applyCheck->insideApplyCall == false) {
        applyCheck->matches = false;
      }
      applyCheck->insideApplyCall = false;
    }
  }
  return;
}

Assistant:

void PostCheckApplyEnclosesArgs(ParseNode* pnode, ByteCodeGenerator* byteCodeGenerator, ApplyCheck* applyCheck)
{
    if ((pnode == nullptr) || (!applyCheck->matches))
    {
        return;
    }

    if (pnode->nop == knopCall)
    {
        if ((!pnode->isUsed) && IsApplyArgs(pnode->AsParseNodeCall()))
        {
            if (!applyCheck->insideApplyCall)
            {
                applyCheck->matches = false;
            }
            applyCheck->insideApplyCall = false;
        }
    }
}